

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generation_iterator.cpp
# Opt level: O3

generation_iterator __thiscall pstore::generation_container::end(generation_container *this)

{
  not_null<const_pstore::database_*> nVar1;
  generation_iterator gVar2;
  not_null<const_pstore::database_*> local_10;
  
  local_10.ptr_ = this->db_;
  gsl::not_null<const_pstore::database_*>::ensure_invariant(&local_10);
  nVar1.ptr_ = local_10.ptr_;
  trailer::validate(local_10.ptr_,(typed_address<pstore::trailer>)0x0);
  gVar2.pos_.a_.a_ = (address)0x0;
  gVar2.db_ = nVar1.ptr_;
  return gVar2;
}

Assistant:

generation_iterator generation_container::end () {
        return {&db_, pstore::typed_address<pstore::trailer>::null ()};
    }